

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<2,_13,_7>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  float *pfVar1;
  long lVar2;
  undefined4 *puVar3;
  long lVar4;
  long lVar5;
  undefined4 uVar6;
  Vector<float,_3> res;
  Type in1;
  Type in0;
  float afStack_d8 [6];
  float local_c0 [6];
  float local_a8 [4];
  Matrix<float,_4,_2> local_98;
  Matrix<float,_4,_4> local_78;
  Matrix<float,_4,_2> local_30;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    pfVar1 = (float *)&local_78;
    lVar2 = 0;
    lVar4 = 0;
    do {
      lVar5 = 0;
      do {
        uVar6 = 0x3f800000;
        if (lVar2 != lVar5) {
          uVar6 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar5) = uVar6;
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x40);
      lVar4 = lVar4 + 1;
      pfVar1 = pfVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar4 != 4);
    local_78.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_78.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_78.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    local_78.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_78.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_78.m_data.m_data[2].m_data._8_8_ = *(undefined8 *)(evalCtx->in[2].m_data + 2);
    local_78.m_data.m_data[3].m_data._0_8_ = *(undefined8 *)evalCtx->in[3].m_data;
    local_78.m_data.m_data[3].m_data._8_8_ = *(undefined8 *)(evalCtx->in[3].m_data + 2);
  }
  else {
    pfVar1 = (float *)&local_78;
    local_78.m_data.m_data[3].m_data[0] = 0.0;
    local_78.m_data.m_data[3].m_data[1] = 0.0;
    local_78.m_data.m_data[3].m_data[2] = 0.0;
    local_78.m_data.m_data[3].m_data[3] = 0.0;
    local_78.m_data.m_data[2].m_data[0] = 0.0;
    local_78.m_data.m_data[2].m_data[1] = 0.0;
    local_78.m_data.m_data[2].m_data[2] = 0.0;
    local_78.m_data.m_data[2].m_data[3] = 0.0;
    local_78.m_data.m_data[1].m_data[0] = 0.0;
    local_78.m_data.m_data[1].m_data[1] = 0.0;
    local_78.m_data.m_data[1].m_data[2] = 0.0;
    local_78.m_data.m_data[1].m_data[3] = 0.0;
    local_78.m_data.m_data[0].m_data[0] = 0.0;
    local_78.m_data.m_data[0].m_data[1] = 0.0;
    local_78.m_data.m_data[0].m_data[2] = 0.0;
    local_78.m_data.m_data[0].m_data[3] = 0.0;
    puVar3 = &s_constInMat4x4;
    lVar2 = 0;
    do {
      lVar4 = 0;
      do {
        pfVar1[lVar4] = (float)*(undefined4 *)((long)puVar3 + lVar4);
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0x10);
      lVar2 = lVar2 + 1;
      pfVar1 = pfVar1 + 1;
      puVar3 = puVar3 + 4;
    } while (lVar2 != 4);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_98.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_98.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_98.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    local_98.m_data.m_data[1].m_data[1] = evalCtx->in[1].m_data[1];
    local_98.m_data.m_data[1].m_data[2] = evalCtx->in[1].m_data[2];
    local_98.m_data.m_data[1].m_data[3] = evalCtx->in[1].m_data[3];
  }
  else {
    local_98.m_data.m_data[0].m_data[0] = -1.2;
    local_98.m_data.m_data[0].m_data[1] = 0.7;
    local_98.m_data.m_data[0].m_data[2] = 0.7;
    local_98.m_data.m_data[0].m_data[3] = -0.4;
    local_98.m_data.m_data[1].m_data[0] = -1.0;
    local_98.m_data.m_data[1].m_data[1] = -1.0;
    local_98.m_data.m_data[1].m_data[2] = 0.7;
    local_98.m_data.m_data[1].m_data[3] = -0.3;
  }
  tcu::operator*(&local_30,&local_78,&local_98);
  local_c0[0] = local_30.m_data.m_data[0].m_data[0];
  local_c0[1] = local_30.m_data.m_data[0].m_data[1];
  local_c0[2] = local_30.m_data.m_data[0].m_data[2];
  local_a8[0] = local_30.m_data.m_data[1].m_data[1];
  local_a8[1] = local_30.m_data.m_data[1].m_data[2];
  local_a8[2] = local_30.m_data.m_data[1].m_data[3];
  afStack_d8[2] = 0.0;
  afStack_d8[3] = 0.0;
  afStack_d8[4] = 0.0;
  lVar2 = 0;
  do {
    afStack_d8[lVar2 + 2] = local_c0[lVar2] + local_a8[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_c0[2] = 0.0;
  local_c0[3] = 1.4013e-45;
  local_c0[4] = 2.8026e-45;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[(int)local_c0[lVar2]] = afStack_d8[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}